

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,QSizeF *size,Unit units)

{
  Unit in_ECX;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QPageSize local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)&size[6].ht + 3) == '\0') {
    (**(code **)((long)size->wd + 0x130))(size);
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QPageSize::QPageSize
            (local_40,(QSizeF *)CONCAT44(in_register_00000014,units),in_ECX,(QString *)&local_58,
             FuzzyMatch);
  supportedPageSizeMatch(this,(QPageSize *)size);
  QPageSize::~QPageSize(local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(const QSizeF &size, QPageSize::Unit units) const
{
    if (!m_havePageSizes)
        loadPageSizes();

    // Try to find a supported page size based on fuzzy-matched unit size
    return supportedPageSizeMatch(QPageSize(size, units));
}